

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  uhugeint_t shift;
  uhugeint_t input;
  uhugeint_t input_00;
  element_type *peVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  idx_t idx_in_entry;
  idx_t iVar10;
  ulong uVar11;
  uint64_t *puVar12;
  uhugeint_t uVar13;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffb0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc0;
  buffer_ptr<ValidityBuffer> *this_01;
  uint64_t in_stack_ffffffffffffffc8;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      puVar12 = &result_data->upper;
      iVar10 = 0;
      do {
        input.upper = in_stack_ffffffffffffffc8;
        input.lower = in_stack_ffffffffffffffc0;
        shift.upper = in_stack_ffffffffffffffb8;
        shift.lower = (uint64_t)in_stack_ffffffffffffffb0;
        uVar13 = BitwiseShiftLeftOperator::
                 Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(input,shift);
        ((uhugeint_t *)(puVar12 + -1))->lower = uVar13.lower;
        *puVar12 = uVar13.upper;
        iVar10 = iVar10 + 1;
        puVar12 = puVar12 + 2;
      } while (count != iVar10);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    this_01 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    puVar12 = &result_data->upper;
    uVar11 = 0;
    do {
      uVar6 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar1[uVar11];
      }
      uVar9 = uVar11;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar11];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)))) {
        input_00.upper = in_stack_ffffffffffffffc8;
        input_00.lower = (uint64_t)this_01;
        uVar13.upper = in_stack_ffffffffffffffb8;
        uVar13.lower = (uint64_t)in_stack_ffffffffffffffb0;
        uVar13 = BitwiseShiftLeftOperator::
                 Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                           (input_00,uVar13);
        ((uhugeint_t *)(puVar12 + -1))->lower = uVar13.lower;
        *puVar12 = uVar13.upper;
        this_00 = in_stack_ffffffffffffffb0;
      }
      else {
        _Var8._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        this_00 = in_stack_ffffffffffffffb0;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          in_stack_ffffffffffffffc8 =
               (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,(unsigned_long *)&stack0xffffffffffffffc8);
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = in_stack_ffffffffffffffb0;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (this_01);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var8._M_head_impl;
        }
        bVar4 = (byte)uVar11 & 0x3f;
        _Var8._M_head_impl[uVar11 >> 6] =
             _Var8._M_head_impl[uVar11 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar11 = uVar11 + 1;
      puVar12 = puVar12 + 2;
      in_stack_ffffffffffffffb0 = this_00;
    } while (count != uVar11);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}